

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall mario::EventLoop::handleRead(EventLoop *this)

{
  Writer *pWVar1;
  Writer local_98;
  ssize_t local_20;
  ssize_t n;
  uint64_t one;
  EventLoop *this_local;
  
  n = 1;
  one = (uint64_t)this;
  local_20 = read(this->_wakeupFd,&n,8);
  if (local_20 != 8) {
    el::base::Writer::Writer
              (&local_98,Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
               ,0x91,"void mario::EventLoop::handleRead()",NormalLog,0);
    pWVar1 = el::base::Writer::construct(&local_98,1,el::base::consts::kDefaultLoggerId);
    pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [31])"EventLoop::handleRead() reads ");
    pWVar1 = el::base::Writer::operator<<(pWVar1,&local_20);
    el::base::Writer::operator<<(pWVar1,(char (*) [20])" bytes instead of 8");
    el::base::Writer::~Writer(&local_98);
  }
  return;
}

Assistant:

void EventLoop::handleRead() {
    uint64_t one = 1;
    ssize_t n = ::read(_wakeupFd, &one, sizeof(one));
    if (n != sizeof(one)) {
        LOG(FATAL) << "EventLoop::handleRead() reads " << n << " bytes instead of 8";
    }
}